

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::fillMetaData(int fd,QFileSystemMetaData *data)

{
  int iVar1;
  MetaDataFlags MVar2;
  uint uVar3;
  long lVar4;
  char *attributes;
  long in_FS_OFFSET;
  bool bVar5;
  stat64 statBuffer;
  statx statxBuffer;
  stat64 local_1b8;
  statx local_128;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x8d598f88;
  (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
  memset(&local_128,0xaa,0x100);
  attributes = "";
  iVar1 = qt_real_statx(fd,"",0x1000,&local_128);
  if (iVar1 == -0x26) {
    memset(&local_1b8,0xaa,0x90);
    iVar1 = fstat64(fd,(stat64 *)&local_1b8);
    bVar5 = iVar1 == 0;
    if (bVar5) {
      QFileSystemMetaData::fillFromStatBuf(data,&local_1b8);
      if ((local_1b8.st_mode & 0xf000) == 0x6000) {
        iVar1 = ioctl(fd,0x80081272);
        if (iVar1 == 0) {
          data->size_ = (qint64)&DAT_aaaaaaaaaaaaaaaa;
        }
      }
    }
  }
  else if (iVar1 == 0) {
    MVar2 = flagsFromStMode((uint)local_128.stx_mode,(quint64)attributes);
    uVar3 = (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
            (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar3;
    (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
         (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
    if (local_128.stx_nlink == 0) {
      (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar3 | 0x40000000;
    }
    data->size_ = local_128.stx_size;
    data->accessTime_ =
         (long)(local_128.stx_atime.tv_sec * 1000000000 + (ulong)local_128.stx_atime.tv_nsec) /
         1000000;
    data->metadataChangeTime_ =
         (long)(local_128.stx_ctime.tv_sec * 1000000000 + (ulong)local_128.stx_ctime.tv_nsec) /
         1000000;
    data->modificationTime_ =
         (long)(local_128.stx_mtime.tv_sec * 1000000000 + (ulong)local_128.stx_mtime.tv_nsec) /
         1000000;
    if ((local_128.stx_mask._1_1_ & 8) == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (long)(local_128.stx_btime.tv_sec * 1000000000 + (ulong)local_128.stx_btime.tv_nsec) /
              1000000;
    }
    data->birthTime_ = lVar4;
    data->userId_ = local_128.stx_uid;
    data->groupId_ = local_128.stx_gid;
    if ((local_128.stx_mode & 0xf000) == 0x6000) {
      local_1b8.st_dev = (__dev_t)&DAT_aaaaaaaaaaaaaaaa;
      iVar1 = ioctl(fd,0x80081272);
      if (iVar1 == 0) {
        data->size_ = local_1b8.st_dev;
      }
    }
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::fillMetaData(int fd, QFileSystemMetaData &data)
{
    auto getSizeForBlockDev = [&](mode_t st_mode) {
#ifdef BLKGETSIZE64
        // Linux
        if (quint64 sz; (st_mode & S_IFMT) == S_IFBLK && ioctl(fd, BLKGETSIZE64, &sz) == 0)
            data.size_ = sz;        // returns byte count
#elif defined(BLKGETSIZE)
        // older Linux
        if (ulong sz; (st_mode & S_IFMT) == S_IFBLK && ioctl(fd, BLKGETSIZE, &sz) == 0)
            data.size_ = sz * 512;  // returns 512-byte sector count
#elif defined(DKIOCGETBLOCKCOUNT)
        // Apple Darwin
        qint32 blksz;
        if (quint64 count; (st_mode & S_IFMT) == S_IFBLK
                && ioctl(fd, DKIOCGETBLOCKCOUNT, &count) == 0
                && ioctl(fd, DKIOCGETBLOCKSIZE, &blksz) == 0)
            data.size_ = count * blksz;
#elif defined(DIOCGMEDIASIZE)
        // FreeBSD
        // see Linux-compat implementation in
        // http://fxr.watson.org/fxr/source/compat/linux/linux_ioctl.c?v=FREEBSD-13-STABLE#L282
        // S_IFCHR is correct: FreeBSD doesn't have block devices any more
        if (QT_OFF_T sz; (st_mode & S_IFMT) == S_IFCHR && ioctl(fd, DIOCGMEDIASIZE, &sz) == 0)
            data.size_ = sz;        // returns byte count
#else
        Q_UNUSED(st_mode);
#endif
    };
    data.entryFlags &= ~QFileSystemMetaData::PosixStatFlags;
    data.knownFlagsMask |= QFileSystemMetaData::PosixStatFlags;

    struct statx statxBuffer;

    int ret = qt_fstatx(fd, &statxBuffer);
    if (ret != -ENOSYS) {
        if (ret == 0) {
            data.fillFromStatxBuf(statxBuffer);
            getSizeForBlockDev(statxBuffer.stx_mode);
            return true;
        }
        return false;
    }

    QT_STATBUF statBuffer;

    if (QT_FSTAT(fd, &statBuffer) == 0) {
        data.fillFromStatBuf(statBuffer);
        getSizeForBlockDev(statBuffer.st_mode);
        return true;
    }

    return false;
}